

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

string * __thiscall
cmState::GetSafeCacheEntryValue(string *__return_storage_ptr__,cmState *this,string *key)

{
  pointer pcVar1;
  CacheEntry *pCVar2;
  
  pCVar2 = cmCacheManager::GetCacheEntry
                     ((this->CacheManager)._M_t.
                      super___uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>
                      .super__Head_base<0UL,_cmCacheManager_*,_false>._M_head_impl,key);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pCVar2 == (CacheEntry *)0x0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar1 = (pCVar2->Value)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (pCVar2->Value)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmState::GetSafeCacheEntryValue(std::string const& key) const
{
  if (cmValue val = this->GetCacheEntryValue(key)) {
    return *val;
  }
  return std::string();
}